

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void scale_1_to_2_phase_0_row(uint8_t *src,uint8_t *dst,int w,__m128i *f)

{
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  __m128i temp;
  __m128i s [8];
  int x;
  int local_13c;
  undefined8 *local_128;
  long local_120;
  
  local_13c = in_EDX;
  local_128 = in_RSI;
  local_120 = in_RDI;
  do {
    scale_1_to_2_phase_0_kernel(*(__m128i **)(local_120 + 4),(__m128i *)0x0);
    *local_128 = extraout_XMM0_Qa;
    local_120 = local_120 + 8;
    local_128 = local_128 + 1;
    local_13c = local_13c + -8;
  } while (local_13c != 0);
  return;
}

Assistant:

static void scale_1_to_2_phase_0_row(const uint8_t *src, uint8_t *dst,
                                     const int w, const __m128i *const f) {
  int x = w;

  do {
    __m128i s[8], temp;
    s[0] = _mm_loadl_epi64((const __m128i *)(src + 0));
    s[1] = _mm_loadl_epi64((const __m128i *)(src + 1));
    s[2] = _mm_loadl_epi64((const __m128i *)(src + 2));
    s[3] = _mm_loadl_epi64((const __m128i *)(src + 3));
    s[4] = _mm_loadl_epi64((const __m128i *)(src + 4));
    s[5] = _mm_loadl_epi64((const __m128i *)(src + 5));
    s[6] = _mm_loadl_epi64((const __m128i *)(src + 6));
    s[7] = _mm_loadl_epi64((const __m128i *)(src + 7));
    temp = scale_1_to_2_phase_0_kernel(s, f);
    _mm_storel_epi64((__m128i *)dst, temp);
    src += 8;
    dst += 8;
    x -= 8;
  } while (x);
}